

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall Player::prepareForBattle(Player *this)

{
  bool bVar1;
  list<BlackCard_*,_std::allocator<BlackCard_*>_> *__x;
  reference ppBVar2;
  ostream *poVar3;
  _Self local_48;
  _List_node_base *local_40;
  _List_iterator<BlackCard_*> local_38;
  iterator it;
  list<BlackCard_*,_std::allocator<BlackCard_*>_> arm;
  char ans;
  Player *this_local;
  
  __x = DynastyDeck::getDynDeck_abi_cxx11_(&this->army);
  std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::list
            ((list<BlackCard_*,_std::allocator<BlackCard_*>_> *)&it,__x);
  std::_List_iterator<BlackCard_*>::_List_iterator(&local_38);
  local_40 = (_List_node_base *)
             std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::begin
                       ((list<BlackCard_*,_std::allocator<BlackCard_*>_> *)&it);
  local_38._M_node = local_40;
  while( true ) {
    local_48._M_node =
         (_List_node_base *)
         std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::end
                   ((list<BlackCard_*,_std::allocator<BlackCard_*>_> *)&it);
    bVar1 = std::operator!=(&local_38,&local_48);
    if (!bVar1) break;
    ppBVar2 = std::_List_iterator<BlackCard_*>::operator*(&local_38);
    bVar1 = BlackCard::isTapped(*ppBVar2);
    if (!bVar1) {
      ppBVar2 = std::_List_iterator<BlackCard_*>::operator*(&local_38);
      BlackCard::PrintCardStats(*ppBVar2);
      poVar3 = std::operator<<((ostream *)&std::cout,"Do you want to use this personality?");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"y for yes, n for no");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::operator>>((istream *)&std::cin,
                      (char *)((long)&arm.
                                      super__List_base<BlackCard_*,_std::allocator<BlackCard_*>_>.
                                      _M_impl._M_node._M_size + 7));
      if (arm.super__List_base<BlackCard_*,_std::allocator<BlackCard_*>_>._M_impl._M_node._M_size.
          _7_1_ == 'y') {
        ppBVar2 = std::_List_iterator<BlackCard_*>::operator*(&local_38);
        BlackCard::setTapped(*ppBVar2,true);
      }
    }
    std::_List_iterator<BlackCard_*>::operator++(&local_38,0);
  }
  std::__cxx11::list<BlackCard_*,_std::allocator<BlackCard_*>_>::~list
            ((list<BlackCard_*,_std::allocator<BlackCard_*>_> *)&it);
  return;
}

Assistant:

void Player::prepareForBattle()                                                 //activates any untapped personalities the player wants for attack
{
    char ans;

    list<BlackCard*> arm = army.getDynDeck();
    list<BlackCard*>::iterator it;

    for (it=arm.begin(); it!=arm.end(); it++)
    {
        if ((*it)->isTapped())                         //tapped means busy somewhere else
            continue;

        (*it)->PrintCardStats();
        cout << "Do you want to use this personality?"<<endl<<"y for yes, n for no"<<endl;
        cin >> ans;

        if (ans == 'y')
            (*it)->setTapped(true);             //every tapped personality will attack
    }
}